

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O3

mpack_node_data_t * mpack_node_map_int_impl(mpack_node_t node,int64_t num)

{
  mpack_tree_error_t p_Var1;
  ulong uVar2;
  mpack_error_t mVar3;
  mpack_tree_t *pmVar4;
  mpack_node_data_t *pmVar5;
  mpack_node_data_t *pmVar6;
  bool bVar7;
  
  pmVar4 = node.tree;
  pmVar5 = node.data;
  if (pmVar4->error != mpack_ok) {
    return (mpack_node_data_t *)0x0;
  }
  if (pmVar5->type == mpack_type_map) {
    uVar2 = (ulong)pmVar5->len;
    if (uVar2 == 0) {
      return (mpack_node_data_t *)0x0;
    }
    pmVar6 = (mpack_node_data_t *)((pmVar5->value).i + 0x10);
    pmVar5 = (mpack_node_data_t *)0x0;
    while ((((pmVar6[-1].type != mpack_type_int &&
             ((num < 0 || (pmVar6[-1].type != mpack_type_uint)))) || (pmVar6[-1].value.i != num)) ||
           (bVar7 = pmVar5 == (mpack_node_data_t *)0x0, pmVar5 = pmVar6, bVar7))) {
      pmVar6 = pmVar6 + 2;
      uVar2 = uVar2 - 1;
      if (uVar2 == 0) {
        return pmVar5;
      }
    }
    pmVar4->error = mpack_error_data;
    p_Var1 = pmVar4->error_fn;
    if (p_Var1 == (mpack_tree_error_t)0x0) {
      return (mpack_node_data_t *)0x0;
    }
    mVar3 = mpack_error_data;
  }
  else {
    pmVar4->error = mpack_error_type;
    p_Var1 = pmVar4->error_fn;
    if (p_Var1 == (mpack_tree_error_t)0x0) {
      return (mpack_node_data_t *)0x0;
    }
    mVar3 = mpack_error_type;
  }
  (*p_Var1)(pmVar4,mVar3);
  return (mpack_node_data_t *)0x0;
}

Assistant:

static mpack_node_data_t* mpack_node_map_int_impl(mpack_node_t node, int64_t num) {
    if (mpack_node_error(node) != mpack_ok)
        return NULL;

    if (node.data->type != mpack_type_map) {
        mpack_node_flag_error(node, mpack_error_type);
        return NULL;
    }

    mpack_node_data_t* found = NULL;

    for (size_t i = 0; i < node.data->len; ++i) {
        mpack_node_data_t* key = mpack_node_child(node, i * 2);

        if ((key->type == mpack_type_int && key->value.i == num) ||
            (key->type == mpack_type_uint && num >= 0 && key->value.u == (uint64_t)num))
        {
            if (found) {
                mpack_node_flag_error(node, mpack_error_data);
                return NULL;
            }
            found = mpack_node_child(node, i * 2 + 1);
        }
    }

    if (found)
        return found;

    return NULL;
}